

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

void __thiscall
MinVR::VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>::
VRDatumSpecialized(VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>
                   *this,vector<float,_std::allocator<float>_> *inVal)

{
  list<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  
  VRDatum::VRDatum(&this->super_VRDatum,VRCORETYPE_FLOATARRAY);
  (this->super_VRDatum)._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0013c6d8;
  this_00 = &this->value;
  (this->value).
  super__List_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->value).
  super__List_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->value).
  super__List_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->needPush = false;
  this->pushed = false;
  this->stackFrame = 1;
  std::__cxx11::
  list<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::push_front(this_00,inVal);
  return;
}

Assistant:

VRDatumSpecialized(const T inVal):
    VRDatum(TID), needPush(false), pushed(false), stackFrame(1) {
    value.push_front(inVal);
  }